

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3OptimizeFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  int iVar1;
  Fts3Cursor *local_38;
  Fts3Cursor *pCursor;
  Fts3Table *p;
  sqlite3_value **ppsStack_20;
  int rc;
  sqlite3_value **apVal_local;
  sqlite3_context *psStack_10;
  int nVal_local;
  sqlite3_context *pContext_local;
  
  ppsStack_20 = apVal;
  apVal_local._4_4_ = nVal;
  psStack_10 = pContext;
  iVar1 = fts3FunctionArg(pContext,"optimize",*apVal,&local_38);
  if (iVar1 == 0) {
    pCursor = (Fts3Cursor *)(local_38->base).pVtab;
    p._4_4_ = sqlite3Fts3Optimize((Fts3Table *)pCursor);
    if (p._4_4_ == 0) {
      sqlite3_result_text(psStack_10,"Index optimized",-1,(_func_void_void_ptr *)0x0);
    }
    else if (p._4_4_ == 0x65) {
      sqlite3_result_text(psStack_10,"Index already optimal",-1,(_func_void_void_ptr *)0x0);
    }
    else {
      sqlite3_result_error_code(psStack_10,p._4_4_);
    }
  }
  return;
}

Assistant:

static void fts3OptimizeFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  int rc;                         /* Return code */
  Fts3Table *p;                   /* Virtual table handle */
  Fts3Cursor *pCursor;            /* Cursor handle passed through apVal[0] */

  UNUSED_PARAMETER(nVal);

  assert( nVal==1 );
  if( fts3FunctionArg(pContext, "optimize", apVal[0], &pCursor) ) return;
  p = (Fts3Table *)pCursor->base.pVtab;
  assert( p );

  rc = sqlite3Fts3Optimize(p);

  switch( rc ){
    case SQLITE_OK:
      sqlite3_result_text(pContext, "Index optimized", -1, SQLITE_STATIC);
      break;
    case SQLITE_DONE:
      sqlite3_result_text(pContext, "Index already optimal", -1, SQLITE_STATIC);
      break;
    default:
      sqlite3_result_error_code(pContext, rc);
      break;
  }
}